

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O2

void Llb_MtrPrint(Llb_Mtr_t *p,int fOrder)

{
  int *__ptr;
  int __c;
  long lVar1;
  uint iVar;
  long lVar2;
  
  if (fOrder == 0) {
    __ptr = (int *)0x0;
  }
  else {
    __ptr = Llb_MtrFindVarOrder(p);
  }
  for (lVar2 = 0; lVar2 < p->nRows; lVar2 = lVar2 + 1) {
    if (__ptr == (int *)0x0) {
      iVar = (uint)lVar2;
    }
    else {
      iVar = __ptr[lVar2];
    }
    printf("%3d : ",(ulong)iVar);
    printf("%3d ",(ulong)(uint)p->pRowSums[(int)iVar]);
    Llb_MtrVarName(p,iVar);
    printf("%3s ",Llb_MtrVarName::Buffer);
    for (lVar1 = 0; lVar1 < p->nCols; lVar1 = lVar1 + 1) {
      __c = 0x20;
      if (p->pMatrix[lVar1][(int)iVar] != '\0') {
        __c = 0x2a;
      }
      putchar(__c);
    }
    putchar(10);
  }
  free(__ptr);
  return;
}

Assistant:

void Llb_MtrPrint( Llb_Mtr_t * p, int fOrder )
{
    int * pOrder = NULL;
    int i, iRow, iCol;
    if ( fOrder )
        pOrder = Llb_MtrFindVarOrder( p );
    for ( i = 0; i < p->nRows; i++ )
    {
        iRow = pOrder ? pOrder[i] : i;
        printf( "%3d : ", iRow );
        printf( "%3d ", p->pRowSums[iRow] );
        printf( "%3s ", Llb_MtrVarName(p, iRow) );
        for ( iCol = 0; iCol < p->nCols; iCol++ )
            printf( "%c", p->pMatrix[iCol][iRow] ? '*' : ' ' );
        printf( "\n" );
    }
    ABC_FREE( pOrder );
}